

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int generate_by_miniscript_or_d
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  uchar last_op [1];
  uchar middle_op [2];
  size_t indexes [2];
  uchar local_1b;
  uchar local_1a [2];
  size_t local_18 [3];
  
  local_1a[0] = 's';
  local_1a[1] = 'd';
  local_1b = 'h';
  local_18[0] = 0;
  local_18[1] = 1;
  iVar1 = generate_by_miniscript_concat
                    (node,parent,derive_child_num,2,local_18,(uchar *)0x0,0,local_1a,2,(uchar *)0x0,
                     0,&local_1b,1,script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_miniscript_or_d(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    unsigned char middle_op[] = {OP_IFDUP, OP_NOTIF};
    unsigned char last_op[] = {OP_ENDIF};
    const size_t indexes[] = {0, 1};
    /* [X] IFDUP NOTIF [Z] ENDIF */
    return generate_by_miniscript_concat(
        node,
        parent,
        derive_child_num,
        2,
        indexes,
        NULL,
        0,
        middle_op,
        sizeof(middle_op) / sizeof(unsigned char),
        NULL,
        0,
        last_op,
        sizeof(last_op) / sizeof(unsigned char),
        script,
        script_len,
        write_len);
}